

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacReadVer.c
# Opt level: O1

int Psr_ManUtilSkipUntil(Psr_Man_t *p,char c)

{
  char *pcVar1;
  char cVar2;
  char *pcVar3;
  int iVar4;
  char *pcVar5;
  
  pcVar3 = p->pLimit;
  pcVar5 = p->pCur;
  iVar4 = 0;
LAB_0039a81f:
  if (pcVar5 < pcVar3) {
    if (*pcVar5 == '/') goto LAB_0039a83a;
    if (*pcVar5 != ';') goto LAB_0039a88d;
    iVar4 = 1;
  }
  return iVar4;
LAB_0039a83a:
  if (pcVar5[1] == '*') {
    pcVar5 = pcVar5 + 2;
    p->pCur = pcVar5;
    if (pcVar5 < pcVar3) {
      do {
        if ((*pcVar5 == '*') && (pcVar5[1] == '/')) {
          pcVar5 = pcVar5 + 2;
          goto LAB_0039a8b2;
        }
        pcVar5 = pcVar5 + 1;
        p->pCur = pcVar5;
      } while (pcVar5 != pcVar3);
    }
  }
  else if (pcVar5[1] == '/') {
    pcVar5 = pcVar5 + 2;
    p->pCur = pcVar5;
    if (pcVar5 < pcVar3) {
      do {
        cVar2 = *pcVar5;
        pcVar5 = pcVar5 + 1;
        p->pCur = pcVar5;
        if (cVar2 == '\n') goto LAB_0039a81f;
      } while (pcVar5 != pcVar3);
    }
  }
LAB_0039a88d:
  if (*pcVar5 == '\\') {
    pcVar5 = pcVar5 + 1;
    do {
      p->pCur = pcVar5;
      if (pcVar3 <= pcVar5) goto LAB_0039a8ac;
      pcVar1 = pcVar5 + 1;
      cVar2 = *pcVar5;
      pcVar5 = pcVar1;
    } while (cVar2 != ' ');
  }
  else {
LAB_0039a8ac:
    pcVar5 = pcVar5 + 1;
  }
LAB_0039a8b2:
  p->pCur = pcVar5;
  goto LAB_0039a81f;
}

Assistant:

static inline int Psr_ManUtilSkipUntil( Psr_Man_t * p, char c )
{
    while ( p->pCur < p->pLimit )
    {
        if ( Psr_ManIsChar(p, c) )
            return 1;
        if ( Psr_ManUtilSkipComments(p) )
            continue;
        if ( Psr_ManUtilSkipName(p) )
            continue;
        p->pCur++;
    }
    return 0;
}